

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall chatra::RuntimeImp::stop(RuntimeImp *this,InstanceId instanceId)

{
  Instance *pIVar1;
  Package *pPVar2;
  undefined8 *puVar3;
  InstanceId local_28;
  InstanceId instanceId_local;
  
  local_28 = instanceId;
  pIVar1 = IdPool<chatra::InstanceId,_chatra::Instance>::lockAndRef(&this->instanceIds,instanceId);
  if ((pIVar1 != (Instance *)0x0) && (pIVar1->primaryPackageId != 0xffffffffffffffff)) {
    SpinLock::lock(&pIVar1->lockThreads);
    if ((pIVar1->threads)._M_h._M_element_count == 0) {
      (pIVar1->lockThreads).flag.super___atomic_flag_base._M_i = false;
      pPVar2 = IdPool<chatra::PackageId,_chatra::Package>::lockAndRef
                         (&this->packageIds,pIVar1->primaryPackageId);
      SpinLock::lock(&pPVar2->lockInstances);
      std::
      _Hashtable<chatra::InstanceId,_std::pair<const_chatra::InstanceId,_std::unique_ptr<chatra::Instance,_std::default_delete<chatra::Instance>_>_>,_std::allocator<std::pair<const_chatra::InstanceId,_std::unique_ptr<chatra::Instance,_std::default_delete<chatra::Instance>_>_>_>,_std::__detail::_Select1st,_std::equal_to<chatra::InstanceId>,_std::hash<chatra::InstanceId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&(pPVar2->instances)._M_h,&local_28);
      (pPVar2->lockInstances).flag.super___atomic_flag_base._M_i = false;
      return;
    }
    puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
    puVar3[2] = 0;
    puVar3[3] = 0;
    puVar3[4] = 0;
    puVar3[1] = puVar3 + 3;
    *(undefined1 *)(puVar3 + 3) = 0;
    *puVar3 = &PTR__NativeException_0023dae0;
    __cxa_throw(puVar3,&UnsupportedOperationException::typeinfo,NativeException::~NativeException);
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
  puVar3[2] = 0;
  puVar3[3] = 0;
  puVar3[4] = 0;
  puVar3[1] = puVar3 + 3;
  *(undefined1 *)(puVar3 + 3) = 0;
  *puVar3 = &PTR__NativeException_0023ce78;
  __cxa_throw(puVar3,&IllegalArgumentException::typeinfo,NativeException::~NativeException);
}

Assistant:

void RuntimeImp::stop(InstanceId instanceId) {
	auto* instance = instanceIds.lockAndRef(instanceId);
	if (instance == nullptr)
		throw IllegalArgumentException();

	auto primaryPackageId = instance->primaryPackageId;
	if (primaryPackageId == enum_max<PackageId>::value)
		throw IllegalArgumentException();

	{
		std::lock_guard<SpinLock> lock0(instance->lockThreads);
		if (!instance->threads.empty())
			throw UnsupportedOperationException();
	}

	auto* package = packageIds.lockAndRef(instance->primaryPackageId);
	chatra_assert(package != nullptr);
	{
		std::lock_guard<SpinLock> lock1(package->lockInstances);
		package->instances.erase(instanceId);
	}
}